

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::MemPass::RemoveBlock(MemPass *this,iterator *bi)

{
  reference this_00;
  Instruction *inst;
  IRContext *this_01;
  type tVar1;
  Function *local_68;
  UnderlyingIterator local_60;
  Instruction *label;
  MemPass *local_48;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  reference local_20;
  value_type *rm_block;
  iterator *bi_local;
  MemPass *this_local;
  
  rm_block = (value_type *)bi;
  bi_local = (iterator *)this;
  this_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(bi);
  label = (Instruction *)this_00;
  local_48 = this;
  local_20 = this_00;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::MemPass::RemoveBlock(spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_40,
             (anon_class_16_2_3cfb9e4e *)&label);
  BasicBlock::ForEachInst(this_00,&local_40,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
  inst = BasicBlock::GetLabelInst(local_20);
  this_01 = Pass::context(&this->super_Pass);
  IRContext::KillInst(this_01,inst);
  tVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::Erase<false>
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)rm_block);
  local_68 = (Function *)tVar1.container_;
  rm_block->function_ = local_68;
  local_60 = tVar1.iterator_._M_current;
  (rm_block->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (Instruction *)local_60._M_current;
  return;
}

Assistant:

void MemPass::RemoveBlock(Function::iterator* bi) {
  auto& rm_block = **bi;

  // Remove instructions from the block.
  rm_block.ForEachInst([&rm_block, this](Instruction* inst) {
    // Note that we do not kill the block label instruction here. The label
    // instruction is needed to identify the block, which is needed by the
    // removal of phi operands.
    if (inst != rm_block.GetLabelInst()) {
      context()->KillInst(inst);
    }
  });

  // Remove the label instruction last.
  auto label = rm_block.GetLabelInst();
  context()->KillInst(label);

  *bi = bi->Erase();
}